

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xml.cpp
# Opt level: O0

bool ON_XMLNodePrivate::IsValidXMLName(wchar_t *wszTagName)

{
  bool bVar1;
  wchar_t local_4c;
  wchar_t *local_48;
  wchar_t *ch;
  int local_38;
  int i;
  int len;
  bool bad;
  ON_wString local_20;
  ON_wString sTagName;
  wchar_t *wszTagName_local;
  
  sTagName.m_s = wszTagName;
  ON_wString::ON_wString(&local_20,wszTagName);
  bVar1 = ON_wString::IsEmpty(&local_20);
  if (bVar1) {
    wszTagName_local._7_1_ = false;
  }
  else {
    i._3_1_ = 0;
    local_38 = ON_wString::Length(&local_20);
    for (ch._4_4_ = 0; ch._4_4_ < local_38; ch._4_4_ = ch._4_4_ + 1) {
      local_4c = ON_wString::operator[](&local_20,ch._4_4_);
      local_48 = &local_4c;
      if (((((local_4c < L'a') || (L'z' < local_4c)) && ((local_4c < L'A' || (L'Z' < local_4c)))) &&
          (local_4c != L'_')) &&
         ((ch._4_4_ < 1 ||
          ((((local_4c < L'0' || (L'9' < local_4c)) && (local_4c != L'-')) && (local_4c != L'.')))))
         ) {
        i._3_1_ = 1;
      }
    }
    if ((i._3_1_ & 1) == 0) {
      wszTagName_local._7_1_ = true;
    }
    else {
      wszTagName_local._7_1_ = false;
    }
  }
  len = 1;
  ON_wString::~ON_wString(&local_20);
  return wszTagName_local._7_1_;
}

Assistant:

bool ON_XMLNodePrivate::IsValidXMLName(const wchar_t* wszTagName) // Static.
{
  // https://www.xml.com/pub/a/2001/07/25/namingparts.html
  //
  // A 'Name' is a token beginning with a letter or one of a few punctuation characters, and continuing with
  // letters, digits, hyphens, underscores, colons, or full stops, together known as name characters.
  // This definition is formally expressed in Extended Backus-Naur Form (EBNF) notation as follows:
  // 
  //  NameChar ::=  Letter | Digit | '.' | '-' | '_' | ':' | CombiningChar | Extender
  //  Name     ::= (Letter | '_' | ':') (NameChar)*

  // We also simplify as follows:
  //
  // - ':' is not actually allowed in tags, it's reserved for XML namespaces, so we disallow it.
  // - 'Letter' must be an ASCII letter: Letter ::= 'a' to 'z' or 'A' to 'Z'.
  // - 'Digit'  must be an ASCII digit:  Digit  ::= '0' to '9'.
  // - 'CombiningChar' and 'Extender' are not supported (disallowed).

  const ON_wString sTagName = wszTagName;
  if (sTagName.IsEmpty())
    return false;

  bool bad = false;

  const int len = sTagName.Length();
  for (int i = 0; i < len; i++)
  {
    const auto& ch = sTagName[i];

    if ((ch >= L'a') && (ch <= L'z'))
      continue;

    if ((ch >= L'A') && (ch <= L'Z'))
      continue;

    if (ch == L'_')
      continue;

    if (i > 0)
    {
      if ((ch >= L'0') && (ch <= L'9'))
        continue;

      if ((ch == '-') || (ch == '.'))
        continue;
    }

    bad = true;
  }

  if (bad)
  {
    return false;
  }

  return true;
}